

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false,_true>_>_>
::_add_bar(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false,_true>_>_>
           *this,Dimension dim)

{
  Dimension dim_local;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false,_true>_>_>
  *this_local;
  
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::_add_bar(Dimension dim)
{
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    _barcode().emplace_back(_nextPosition(), Master_matrix::template get_null_value<Pos_index>(), dim);
    if constexpr (Master_matrix::Option_list::has_removable_columns) {
      _indexToBar().try_emplace(_nextPosition(), --_barcode().end());
    } else {
      _indexToBar().push_back(_barcode().size() - 1);
    }
    ++_nextPosition();
  }
}